

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

bool __thiscall
iutest::detail::SizeIsMatcher<unsigned_int>::Check<int,3ul>
          (SizeIsMatcher<unsigned_int> *this,int (*param_1) [3])

{
  bool bVar1;
  unsigned_long local_58;
  EqMatcher<unsigned_int> local_50;
  AssertionResult local_40;
  int (*local_18) [3];
  int (*param_1_local) [3];
  SizeIsMatcher<unsigned_int> *this_local;
  
  local_18 = param_1;
  param_1_local = (int (*) [3])this;
  CastToMatcher<unsigned_int>((uint *)&local_50,(type **)&this->m_expected);
  local_58 = 3;
  EqMatcher<unsigned_int>::operator()(&local_40,&local_50,&local_58);
  bVar1 = AssertionResult::operator_cast_to_bool(&local_40);
  AssertionResult::~AssertionResult(&local_40);
  EqMatcher<unsigned_int>::~EqMatcher(&local_50);
  return bVar1;
}

Assistant:

bool Check(const U(&)[SIZE])
    {
        return static_cast<bool>(CastToMatcher(m_expected)(SIZE));
    }